

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::VarintTest_TestWriteNullConstant_Test::TestBody
          (VarintTest_TestWriteNullConstant_Test *this)

{
  char *message;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58 [32];
  ByteBuffer buffer;
  undefined1 local_30 [40];
  
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(&buffer,10);
  std::__cxx11::string::string(local_58,(string *)&Varint::kNullString_abi_cxx11_);
  bidfx_public_api::tools::Varint::WriteString(local_30,local_58);
  std::__cxx11::string::~string(local_58);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78.field_2._M_allocated_capacity._0_2_ = 0;
  local_78._M_string_length = 1;
  bidfx_public_api::tools::ByteBuffer::ToString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"std::string(\"\\000\", 1)","buffer.ToString()",&local_78,
             &local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/varint_test.cpp"
               ,0xcb,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&buffer);
  return;
}

Assistant:

TEST(VarintTest, TestWriteNullConstant)
{
    ByteBuffer buffer = ByteBuffer(10);
    Varint::WriteString(buffer, Varint::kNullString);
    EXPECT_EQ(std::string("\000", 1), buffer.ToString());
}